

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O3

void __thiscall
gl3cts::GPUShader5FunctionOverloadingTest::execute
          (GPUShader5FunctionOverloadingTest *this,GLint *u1_data,GLuint *u2_data,
          bool is_black_expected)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  programInfo program;
  programInfo local_40;
  long lVar3;
  
  iVar1 = (*((this->super_GPUShader5ImplicitConversionsTest).super_TestCase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_40.m_context = (this->super_GPUShader5ImplicitConversionsTest).super_TestCase.m_context;
  local_40.m_fragment_shader_id = 0;
  local_40.m_program_object_id = 0;
  local_40.m_vertex_shader_id = 0;
  Utils::programInfo::build
            (&local_40,
             "#version 130\n\nin  vec4 result;\nout vec4 color;\n\nvoid main()\n{\n    color = result;\n}\n\n"
             ,
             "#version 130\n#extension GL_ARB_gpu_shader5 : require\n\nuniform ivec4 u1;\nuniform uvec4 u2;\n\nout     vec4  result;\n\nvec4 f(in vec4 a, in vec4 b)\n{\n    return a * b;\n}\n\nvec4 f(in uvec4 a, in uvec4 b)\n{\n    return vec4(a - b);\n}\n\nvoid main()\n{\n    result = f(u1, u2);\n\n    switch (gl_VertexID)\n    {\n      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n    }\n}\n\n"
            );
  (**(code **)(lVar3 + 0x1680))(local_40.m_program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x32b);
  Utils::programInfo::setUniform(&local_40,VARIABLE_TYPE_IVEC4,"u1",u1_data);
  Utils::programInfo::setUniform(&local_40,VARIABLE_TYPE_UVEC4,"u2",u2_data);
  (**(code **)(lVar3 + 0x1c0))(0x3f000000,0x3f000000,0x3f000000,0x3f000000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"clearColor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x332);
  (**(code **)(lVar3 + 0x188))(0x4000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x335);
  (**(code **)(lVar3 + 0x538))(5,0,4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x339);
  Utils::programInfo::~programInfo(&local_40);
  GPUShader5ImplicitConversionsTest::verifyImage
            (&this->super_GPUShader5ImplicitConversionsTest,0,is_black_expected);
  return;
}

Assistant:

void GPUShader5FunctionOverloadingTest::execute(const glw::GLint* u1_data, const glw::GLuint* u2_data,
												bool is_black_expected)
{
	static const glw::GLuint black_color = 0x00000000;

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Run test case */
	{
		/* Shaders */
		const char* fs = "#version 130\n"
						 "\n"
						 "in  vec4 result;\n"
						 "out vec4 color;\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "    color = result;\n"
						 "}\n"
						 "\n";

		const char* vs = "#version 130\n"
						 "#extension GL_ARB_gpu_shader5 : require\n"
						 "\n"
						 "uniform ivec4 u1;\n"
						 "uniform uvec4 u2;\n"
						 "\n"
						 "out     vec4  result;\n"
						 "\n"
						 "vec4 f(in vec4 a, in vec4 b)\n"
						 "{\n"
						 "    return a * b;\n"
						 "}\n"
						 "\n"
						 "vec4 f(in uvec4 a, in uvec4 b)\n"
						 "{\n"
						 "    return vec4(a - b);\n"
						 "}\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "    result = f(u1, u2);\n"
						 "\n"
						 "    switch (gl_VertexID)\n"
						 "    {\n"
						 "      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n"
						 "      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n"
						 "      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n"
						 "      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n"
						 "    }\n"
						 "}\n"
						 "\n";

		/* Prepare program */
		Utils::programInfo program(m_context);

		program.build(fs, vs);

		gl.useProgram(program.m_program_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		program.setUniform(Utils::VARIABLE_TYPE_IVEC4, "u1", u1_data);
		program.setUniform(Utils::VARIABLE_TYPE_UVEC4, "u2", u2_data);

		/* Clear FBO */
		gl.clearColor(0.5f, 0.5f, 0.5f, 0.5f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clearColor");

		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

		/* Draw a triangle strip */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");
	}

	/* Verification */
	verifyImage(black_color, is_black_expected);
}